

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

char * jas_iccsigtostr(int sig,char *buf)

{
  uint uVar1;
  ushort **ppuVar2;
  char *local_28;
  char *bufptr;
  int c;
  int n;
  char *buf_local;
  int sig_local;
  
  bufptr._4_4_ = 4;
  local_28 = buf;
  buf_local._4_4_ = sig;
  do {
    if (bufptr._4_4_ < 1) {
      *local_28 = '\0';
      return buf;
    }
    uVar1 = buf_local._4_4_ >> 0x18 & 0xff;
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)uVar1] & 0x400) == 0) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)uVar1] & 0x800) != 0) goto LAB_00113086;
    }
    else {
LAB_00113086:
      *local_28 = (char)((uint)buf_local._4_4_ >> 0x18);
      local_28 = local_28 + 1;
    }
    buf_local._4_4_ = buf_local._4_4_ << 8;
    bufptr._4_4_ = bufptr._4_4_ + -1;
  } while( true );
}

Assistant:

static char *jas_iccsigtostr(int sig, char *buf)
{
	int n;
	int c;
	char *bufptr;
	bufptr = buf;
	for (n = 4; n > 0; --n) {
		c = (sig >> 24) & 0xff;
		if (isalpha(c) || isdigit(c)) {
			*bufptr++ = c;
		}
		sig <<= 8;
	}
	*bufptr = '\0';
	return buf;
}